

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packet.cpp
# Opt level: O1

void __thiscall Packet::Packet(Packet *this,char *data,socket *socket,shared_ptr<KeyValueStore> *k)

{
  pointer *ppcVar1;
  uint uVar2;
  KeyValueStore *this_00;
  pointer __dest;
  ulong uVar3;
  size_t __n;
  pair<bool,_const_FlaggedValue_&> pVar4;
  string msg;
  vector<char,_std::allocator<char>_> val;
  FlaggedValue local_90;
  void *local_70;
  long local_68;
  FlaggedValue local_58;
  
  (this->val).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->val).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->key).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->val).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->key).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->key).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  uVar2 = *(uint *)(data + 8);
  this->bod_len = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
  uVar2 = *(uint *)(data + 0xc);
  this->opaque = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
  this->key_len = *(ushort *)(data + 2) << 8 | *(ushort *)(data + 2) >> 8;
  this->op = data[1];
  this->ext_len = (int)data[4];
  read(this,(int)socket,socket,(size_t)k);
  if (data[1] == '\x01') {
    this_00 = (k->super___shared_ptr<KeyValueStore,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    std::vector<char,_std::allocator<char>_>::vector(&local_90.value,&this->val);
    local_90.flags = this->flags;
    KeyValueStore::set(this_00,&this->key,&local_90);
    if (local_90.value.super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_90.value.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    respondToSet(this,socket);
  }
  else if (data[1] == '\0') {
    pVar4 = KeyValueStore::get((k->super___shared_ptr<KeyValueStore,_(__gnu_cxx::_Lock_policy)2>).
                               _M_ptr,&this->key);
    if (((undefined1  [16])pVar4 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      ppcVar1 = &local_90.value.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
      local_90.value.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
      ._M_start = (pointer)ppcVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"Key not found","");
      std::vector<char,std::allocator<char>>::
      vector<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
                ((vector<char,std::allocator<char>> *)&local_70,
                 (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )local_90.value.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start,
                 (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )(local_90.value.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_finish +
                   (long)local_90.value.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_start),(allocator_type *)&local_58);
      local_58.value.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
      ._M_start = (pointer)0x0;
      local_58.value.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
      ._M_finish = (pointer)0x0;
      local_58.value.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
      ._M_end_of_storage = (pointer)0x0;
      uVar3 = local_68 - (long)local_70;
      if (uVar3 == 0) {
        __dest = (pointer)0x0;
      }
      else {
        if ((long)uVar3 < 0) {
          std::__throw_bad_alloc();
        }
        __dest = (pointer)operator_new(uVar3);
      }
      local_58.value.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
      ._M_end_of_storage = __dest + uVar3;
      __n = local_68 - (long)local_70;
      local_58.value.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
      ._M_start = __dest;
      if (__n != 0) {
        local_58.value.super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_finish = __dest;
        memmove(__dest,local_70,__n);
      }
      local_58.value.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
      ._M_finish = __dest + __n;
      local_58.flags = 0;
      respondToGet(this,socket,&local_58,false);
      if (__dest != (pointer)0x0) {
        operator_delete(__dest);
      }
      if (local_70 != (void *)0x0) {
        operator_delete(local_70);
      }
      if ((pointer *)
          local_90.value.super__Vector_base<char,_std::allocator<char>_>._M_impl.
          super__Vector_impl_data._M_start != ppcVar1) {
        operator_delete(local_90.value.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
    }
    else {
      respondToGet(this,socket,pVar4.second,true);
    }
  }
  return;
}

Assistant:

Packet::Packet(char data[24], socket& socket,
               const std::shared_ptr<KeyValueStore>& k)
    : bod_len(readUInt32LE(data, 8)),
      opaque(readUInt32LE(data, 12)),
      key_len(readUInt16LE(data, 2)),
      op(data[1]),
      ext_len(data[4]) {

  read(socket);
  if (data[1] == static_cast<char>(OpCode::GET)) {
    std::pair<bool, const FlaggedValue&> value{ k->get(key) };
    if (value.first) {
      respondToGet(socket, value.second, true);
    } else {
      std::string msg = "Key not found";
      std::vector<char> val(msg.cbegin(), msg.cend());
      respondToGet(socket, FlaggedValue{ val, 0 }, false);
    }
  } else if (data[1] == static_cast<char>(OpCode::SET)) {
    k->set(key, FlaggedValue{ val, flags });
    respondToSet(socket);
  }
}